

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O0

Maybe<wchar_t> __thiscall rc::Seq<wchar_t>::next(Seq<wchar_t> *this)

{
  bool bVar1;
  pointer pIVar2;
  unique_ptr *in_RSI;
  Seq<wchar_t> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<rc::Seq<wchar_t>::ISeqImpl,_std::default_delete<rc::Seq<wchar_t>::ISeqImpl>_>
             ::operator->((unique_ptr<rc::Seq<wchar_t>::ISeqImpl,_std::default_delete<rc::Seq<wchar_t>::ISeqImpl>_>
                           *)in_RSI);
    (**pIVar2->_vptr_ISeqImpl)(this);
  }
  else {
    Maybe<wchar_t>::Maybe((Maybe<wchar_t> *)this);
  }
  return (Maybe<wchar_t>)this;
}

Assistant:

Maybe<T> Seq<T>::next() noexcept {
  try {
    return m_impl ? m_impl->next() : Nothing;
  } catch (...) {
    m_impl.reset();
    return Nothing;
  }
}